

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_get_expr_minmax
              (fitsfile *fptr,char *expr,double *datamin,double *datamax,int *datatype,int *status)

{
  int iVar1;
  long lVar2;
  double dVar3;
  undefined8 local_2d8;
  double double_nulval;
  char tdimKwd [9];
  char nullKwd [9];
  char tform [16];
  char card [81];
  Node *result;
  int colNo;
  int col_cnt;
  long nrows;
  long width;
  long repeat;
  long naxes [5];
  long nelem;
  int newNullKwd;
  int typecode;
  int constant;
  int naxis;
  histo_minmax_workfn_struct minmaxWorkFn;
  ParseData lParse;
  parseInfo Info;
  int *status_local;
  int *datatype_local;
  double *datamax_local;
  double *datamin_local;
  char *expr_local;
  fitsfile *fptr_local;
  
  local_2d8 = 0xb8a83e285ebab4b7;
  if (*status == 0) {
    memset(&constant,0,0x28);
    memset(&lParse.status,0,0x90);
    memset(&minmaxWorkFn.ngood,0,0xe8);
    if (datatype != (int *)0x0) {
      *datatype = 0;
    }
    ffgky(fptr,0x29,"NAXIS2",&colNo,(char *)0x0,status);
    iVar1 = ffiprs(fptr,0,expr,5,&lParse.status,naxes + 4,&typecode,&repeat,
                   (ParseData *)&minmaxWorkFn.ngood,status);
    if (iVar1 == 0) {
      if (datatype != (int *)0x0) {
        *datatype = lParse.status;
      }
      if (naxes[4] < 0) {
        lVar2 = lParse._48_8_ + (long)lParse.nNodes * 0x180;
        if (lParse.status == 1) {
          dVar3 = (double)(*(char *)(lVar2 + 0x80) != '\0');
          *datamax = dVar3;
          *datamin = dVar3;
        }
        else if (lParse.status == 0xe) {
          dVar3 = (double)(*(char *)(lVar2 + 0x80) == '\x01');
          *datamax = dVar3;
          *datamin = dVar3;
        }
        else if (lParse.status == 0x29) {
          lVar2 = *(long *)(lVar2 + 0x80);
          *datamax = (double)lVar2;
          *datamin = (double)lVar2;
        }
        else if (lParse.status == 0x52) {
          dVar3 = *(double *)(lVar2 + 0x80);
          *datamax = dVar3;
          *datamin = dVar3;
        }
        ffcprs((ParseData *)&minmaxWorkFn.ngood);
        fptr_local._4_4_ = *status;
      }
      else {
        iVar1 = fits_parser_set_temporary_col
                          ((ParseData *)&minmaxWorkFn.ngood,(parseInfo *)&lParse.status,_colNo,
                           &local_2d8,status);
        if (iVar1 == 0) {
          _constant = &lParse.status;
          minmaxWorkFn.datamin = -9.1191291391491e-36;
          minmaxWorkFn.Info = (parseInfo *)0xb8a83e285ebab4b7;
          minmaxWorkFn.ntotal = 0;
          minmaxWorkFn.datamax = 0.0;
          iVar1 = ffiter((int)lParse.nRows,(iteratorCol *)lParse.nAxes[4],0,0,
                         histo_minmax_expr_workfn,&constant,status);
          if (iVar1 == -1) {
            *status = 0;
          }
          if (datamin != (double *)0x0) {
            *datamin = (double)minmaxWorkFn.Info;
          }
          if (datamax != (double *)0x0) {
            *datamax = minmaxWorkFn.datamin;
          }
          ffcprs((ParseData *)&minmaxWorkFn.ngood);
          fptr_local._4_4_ = *status;
        }
        else {
          ffcprs((ParseData *)&minmaxWorkFn.ngood);
          fptr_local._4_4_ = *status;
        }
      }
    }
    else {
      ffcprs((ParseData *)&minmaxWorkFn.ngood);
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_get_expr_minmax(fitsfile *fptr, char *expr, double *datamin, 
			 double *datamax, int *datatype, int *status)
/* 
   Simple utility routine to compute the min and max value in an expression
*/
{
   parseInfo Info;
   ParseData lParse;
   struct histo_minmax_workfn_struct minmaxWorkFn;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width, nrows;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   double double_nulval = DOUBLENULLVALUE;

   if( *status ) return( *status );

   memset(&minmaxWorkFn, 0, sizeof(minmaxWorkFn));
   memset(&Info, 0, sizeof(Info));
   memset(&lParse, 0, sizeof(lParse));
   if (datatype) *datatype = 0;

   ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

   if( ffiprs( fptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }

   if (datatype) *datatype = Info.datatype;

   if( nelem<0 ) { /* Constant already computed */
      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE: *datamin = *datamax = result->value.data.dbl; break;
      case TLONG:   *datamin = *datamax = (double) result->value.data.lng; break;
      case TLOGICAL:*datamin = *datamax = (double) ((result->value.data.log == 1)?1:0); break;
      case TBIT:    *datamin = *datamax = (double) ((result->value.data.str[0])?1:0); break;
      }
      ffcprs(&lParse);
      return( *status );
   }

   Info.parseData = &lParse;

   /* Add a temporary column which contains the expression value */
   if ( fits_parser_set_temporary_col( &lParse, &Info, nrows, &double_nulval, status) ) {
     ffcprs(&lParse);
     return( *status );
   }

   /* Initialize the work function computing min/max */
   minmaxWorkFn.Info = &Info;
   minmaxWorkFn.datamin = minmaxWorkFn.datamax = DOUBLENULLVALUE;
   minmaxWorkFn.ntotal = minmaxWorkFn.ngood = 0;
   
   if( ffiter( lParse.nCols, lParse.colData, 0, 0,
	       histo_minmax_expr_workfn, (void*)&minmaxWorkFn, status ) == -1 )
     *status = 0;  /* -1 indicates exitted without error before end... OK */

   if (datamin) *datamin = minmaxWorkFn.datamin;
   if (datamax) *datamax = minmaxWorkFn.datamax;

   ffcprs(&lParse);
   return(*status);

}